

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

void Map_MappingSetPiArrivalTimes(Map_Man_t *p)

{
  float *pfVar1;
  Map_Node_t *pMVar2;
  int iVar3;
  Map_Time_t *pMVar4;
  float fVar5;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  int local_1c;
  float Time;
  int i;
  Map_Node_t *pNode;
  Map_Man_t *p_local;
  
  for (local_1c = 0; local_1c < p->nInputs; local_1c = local_1c + 1) {
    pMVar2 = p->pInputs[local_1c];
    iVar3 = Scl_ConIsRunning();
    if (iVar3 == 0) {
      pMVar4 = p->pInputArrivals + local_1c;
      fVar5 = pMVar4->Fall;
      pMVar2->tArrival[1].Rise = pMVar4->Rise;
      pMVar2->tArrival[1].Fall = fVar5;
      pMVar2->tArrival[1].Worst = pMVar4->Worst;
    }
    else {
      fVar5 = Scl_ConGetInArrFloat(local_1c);
      pMVar2->tArrival[1].Fall = fVar5;
      pMVar2->tArrival[1].Rise = fVar5;
      pMVar2->tArrival[1].Worst = fVar5;
    }
    if (p->pNodeDelays == (float *)0x0) {
      local_24 = 0.0;
    }
    else {
      local_24 = p->pNodeDelays[pMVar2->Num];
    }
    pMVar2->tArrival[1].Rise = local_24 + pMVar2->tArrival[1].Rise;
    if (p->pNodeDelays == (float *)0x0) {
      local_28 = 0.0;
    }
    else {
      local_28 = p->pNodeDelays[pMVar2->Num];
    }
    pMVar2->tArrival[1].Fall = local_28 + pMVar2->tArrival[1].Fall;
    if (p->pNodeDelays == (float *)0x0) {
      local_2c = 0.0;
    }
    else {
      local_2c = p->pNodeDelays[pMVar2->Num];
    }
    pMVar2->tArrival[1].Worst = local_2c + pMVar2->tArrival[1].Worst;
    pMVar2->tArrival[0].Rise = pMVar2->tArrival[1].Fall + (p->pSuperLib->tDelayInv).Rise;
    pMVar2->tArrival[0].Fall = pMVar2->tArrival[1].Rise + (p->pSuperLib->tDelayInv).Fall;
    fVar5 = pMVar2->tArrival[0].Rise;
    pfVar1 = &pMVar2->tArrival[0].Fall;
    if (fVar5 < *pfVar1 || fVar5 == *pfVar1) {
      local_30 = pMVar2->tArrival[0].Fall;
    }
    else {
      local_30 = pMVar2->tArrival[0].Rise;
    }
    pMVar2->tArrival[0].Worst = local_30;
  }
  return;
}

Assistant:

void Map_MappingSetPiArrivalTimes( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->nInputs; i++ )
    {
        pNode = p->pInputs[i];
        // set the arrival time of the positive phase
        if ( Scl_ConIsRunning() )
        {
            float Time = Scl_ConGetInArrFloat( i );
            pNode->tArrival[1].Fall  = Time;
            pNode->tArrival[1].Rise  = Time;
            pNode->tArrival[1].Worst = Time;
        }
        else
            pNode->tArrival[1] = p->pInputArrivals[i];
        pNode->tArrival[1].Rise  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Fall  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Worst += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        // set the arrival time of the negative phase
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
}